

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::TiledInputFile::Data::initialize(Data *this)

{
  exr_storage_t eVar1;
  int iVar2;
  ArgExc *pAVar3;
  exr_context_t p_Var4;
  long in_RDI;
  int in_stack_0000019c;
  Context *in_stack_000001a0;
  
  eVar1 = Context::storage(in_stack_000001a0,in_stack_0000019c);
  if (eVar1 != EXR_STORAGE_TILED) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"File part is not a tiled part");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  p_Var4 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x23d0c8);
  iVar2 = exr_get_tile_descriptor
                    (p_Var4,*(undefined4 *)(in_RDI + 8),in_RDI + 0x4c,in_RDI + 0x50,in_RDI + 0x54,
                     in_RDI + 0x58);
  if (iVar2 != 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to query tile descriptor");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  p_Var4 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x23d15f);
  iVar2 = exr_get_tile_levels(p_Var4,*(undefined4 *)(in_RDI + 8),in_RDI + 0x5c,in_RDI + 0x60);
  if (iVar2 != 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to query number of tile levels");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return;
}

Assistant:

void initialize ()
    {
        if (_ctxt->storage (partNumber) != EXR_STORAGE_TILED)
            throw IEX_NAMESPACE::ArgExc ("File part is not a tiled part");

        if (EXR_ERR_SUCCESS != exr_get_tile_descriptor (
                *_ctxt,
                partNumber,
                &tile_x_size,
                &tile_y_size,
                &tile_level_mode,
                &tile_round_mode))
            throw IEX_NAMESPACE::ArgExc ("Unable to query tile descriptor");

        if (EXR_ERR_SUCCESS != exr_get_tile_levels (
                *_ctxt,
                partNumber,
                &num_x_levels,
                &num_y_levels))
            throw IEX_NAMESPACE::ArgExc ("Unable to query number of tile levels");
    }